

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeIncrSwap(IncrMerger *pIncr)

{
  long lVar1;
  SorterCompare p_Var2;
  sqlite3_file *psVar3;
  SortSubtask *in_RDI;
  long in_FS_OFFSET;
  int rc;
  SorterFile f0;
  IncrMerger *in_stack_00000020;
  int local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&(in_RDI->list).pList == 0) {
    local_24 = vdbeIncrPopulate(in_stack_00000020);
    (in_RDI->list).aMemory = (u8 *)in_RDI->xCompare;
    (in_RDI->list).szPMA = (i64)(in_RDI->file).pFd;
    if ((VdbeSorter *)(in_RDI->list).szPMA == in_RDI->pSorter) {
      *(undefined4 *)((long)&in_RDI->pUnpacked + 4) = 1;
    }
  }
  else {
    local_24 = vdbeSorterJoinThread(in_RDI);
    if (local_24 == 0) {
      p_Var2 = (SorterCompare)(in_RDI->list).aMemory;
      psVar3 = (sqlite3_file *)(in_RDI->list).szPMA;
      (in_RDI->list).aMemory = (u8 *)in_RDI->xCompare;
      (in_RDI->list).szPMA = (i64)(in_RDI->file).pFd;
      in_RDI->xCompare = p_Var2;
      (in_RDI->file).pFd = psVar3;
      if ((VdbeSorter *)(in_RDI->list).szPMA == in_RDI->pSorter) {
        *(undefined4 *)((long)&in_RDI->pUnpacked + 4) = 1;
      }
      else {
        local_24 = vdbeIncrBgPopulate((IncrMerger *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbeIncrSwap(IncrMerger *pIncr){
  int rc = SQLITE_OK;

#if SQLITE_MAX_WORKER_THREADS>0
  if( pIncr->bUseThread ){
    rc = vdbeSorterJoinThread(pIncr->pTask);

    if( rc==SQLITE_OK ){
      SorterFile f0 = pIncr->aFile[0];
      pIncr->aFile[0] = pIncr->aFile[1];
      pIncr->aFile[1] = f0;
    }

    if( rc==SQLITE_OK ){
      if( pIncr->aFile[0].iEof==pIncr->iStartOff ){
        pIncr->bEof = 1;
      }else{
        rc = vdbeIncrBgPopulate(pIncr);
      }
    }
  }else
#endif
  {
    rc = vdbeIncrPopulate(pIncr);
    pIncr->aFile[0] = pIncr->aFile[1];
    if( pIncr->aFile[0].iEof==pIncr->iStartOff ){
      pIncr->bEof = 1;
    }
  }

  return rc;
}